

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertWithExpressions<mp::LinTerms,mp::AlgConRange>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *con,int i,
          ConstraintAcceptanceLevel cal,ExpressionAcceptanceLevel param_4)

{
  bool bVar1;
  bool bVar2;
  NodeRange NVar3;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  local_30;
  
  if ((*(int *)(this + 0x40) != 1) ||
     ((cal == Recommended &&
      (bVar1 = Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ::HasExpressionArgs((Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                    *)this,&con->super_LinTerms), !bVar1)))) {
    return false;
  }
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::SelectValueNode<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)(this + -0x208),i);
  *(NodeRange *)(this + 0x840) = NVar3;
  local_30.cvt_ =
       (FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        *)(this + -0x208);
  bVar1 = Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::HasLogicalExpressionArgs
                    ((Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                      *)this,&con->super_LinTerms);
  if (bVar1) {
    bVar1 = HandleLogicalArgs<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>(this,con,i);
    bVar2 = true;
    if (bVar1) goto LAB_0025d532;
  }
  bVar2 = ConvertToNLCon<mp::LinTerms,mp::AlgConRange>(this,con,i);
LAB_0025d532:
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(&local_30);
  return bVar2;
}

Assistant:

bool ConvertWithExpressions(
      const AlgebraicConstraint<Body, RhsOrRange>& con,
      int i,
      ConstraintAcceptanceLevel cal, ExpressionAcceptanceLevel ) {
    assert(stage_cvt2expr_>0);
    /// Replace \a con by a NLConstraint,
    /// if either the ModelAPI does not accept it,
    /// or the linear/quadratic terms have expressions
    /// (and then they are non-flat.)
    if (1==stage_cvt2expr_
        && (ConstraintAcceptanceLevel::Recommended != cal
            || HasExpressionArgs(con.GetBody()))) {
      auto alscope = MPD( MakeAutoLinker( con, i ) );   // link from \a con
      if (HasLogicalExpressionArgs(con.GetBody()))
        if (HandleLogicalArgs(con, i))
          return true;                     // to remove the original \a con
      return ConvertToNLCon(con, i);       // convert if expr's, or not acc
    }
    return false;
  }